

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiff_io.cc
# Opt level: O1

void gimage::anon_unknown_6::readRow<float>
               (Image<float,_gimage::PixelTraits<float>_> *ret,uint32_t k,TiffImage<float> *tif,
               uint32_t row,uint16_t d)

{
  ushort uVar1;
  uint uVar2;
  float *ret_00;
  float ***pppfVar3;
  pointer pfVar4;
  ulong uVar5;
  long lVar6;
  
  Image<float,_gimage::PixelTraits<float>_>::setSize
            (ret,(ulong)tif->width,(ulong)tif->height,(ulong)tif->depth);
  if ((tif->is_planar == false) && (tif->depth != 1)) {
    std::vector<float,_std::allocator<float>_>::resize
              (&tif->row,(ulong)((uint)tif->depth * tif->width));
    ret_00 = (tif->row).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    readUnpacked<float>(ret_00,(uint32_t)
                               ((ulong)((long)(tif->row).
                                              super__Vector_base<float,_std::allocator<float>_>.
                                              _M_impl.super__Vector_impl_data._M_finish -
                                       (long)ret_00) >> 2),tif,row,0);
    uVar2 = tif->width;
    if ((ulong)uVar2 != 0) {
      pfVar4 = (tif->row).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar1 = tif->depth;
      pppfVar3 = ret->img;
      uVar5 = 0;
      do {
        if (uVar1 != 0) {
          lVar6 = 0;
          do {
            *(undefined4 *)
             (*(long *)(*(long *)((long)pppfVar3 + lVar6 * 2) + (ulong)k * 8) + uVar5 * 4) =
                 *(undefined4 *)((long)pfVar4 + lVar6);
            lVar6 = lVar6 + 4;
          } while ((ulong)uVar1 << 2 != lVar6);
          pfVar4 = (pointer)((long)pfVar4 + lVar6);
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 != uVar2);
    }
    return;
  }
  readUnpacked<float>(ret->img[d][k],tif->width,tif,row,d);
  return;
}

Assistant:

void readRow(gimage::Image<T> &ret, uint32_t k, TiffImage<T> &tif, uint32_t row,
  uint16_t d)
{
  ret.setSize(tif.width, tif.height, tif.depth);

  if (tif.is_planar || tif.depth == 1)
  {
    readUnpacked(ret.getPtr(0, k, d), tif.width, tif, row, d);
  }
  else
  {
    tif.row.resize(tif.width*tif.depth);
    readUnpacked(tif.row.data(), static_cast<uint32_t>(tif.row.size()), tif, row, 0);

    T *p=tif.row.data();
    for (uint32_t i=0; i<tif.width; i++)
    {
      for (uint16_t d=0; d<tif.depth; d++)
      {
        ret.set(i, k, d, *p++);
      }
    }
  }
}